

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O1

void __thiscall OpenMD::Molecule::addAtom(Molecule *this,Atom *atom)

{
  pointer *pppAVar1;
  iterator __position;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  _Var2;
  Atom *local_10;
  
  local_10 = atom;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Atom*const>>
                    ((this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (__position._M_current ==
        (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>::
      _M_realloc_insert<OpenMD::Atom*const&>
                ((vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>> *)&this->atoms_,__position,
                 &local_10);
    }
    else {
      *__position._M_current = local_10;
      pppAVar1 = &(this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
    }
  }
  return;
}

Assistant:

void Molecule::addAtom(Atom* atom) {
    if (std::find(atoms_.begin(), atoms_.end(), atom) == atoms_.end()) {
      atoms_.push_back(atom);
    }
  }